

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_encoder_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::HexEncoderTest_test_encode_as_hex_Test::TestBody
          (HexEncoderTest_test_encode_as_hex_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_1e8;
  Message local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_6;
  Message local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_5;
  Message local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_4;
  Message local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_3;
  Message local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_2;
  Message local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_60;
  Message local_58 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  HexEncoderTest_test_encode_as_hex_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_40,0x310d18);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_20,"\"\"","HexEncoder::EncodeAsHex((unsigned char *) \"\", 0)"
             ,(char (*) [1])0x310d18,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message(local_58);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_98,0x34e591);
    testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
              ((EqHelper<false> *)local_78,"\"3a\"",
               "HexEncoder::EncodeAsHex((unsigned char *) \":\", 1)",(char (*) [3])"3a",&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
    if (!bVar1) {
      testing::Message::Message(&local_a0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                 ,0x1b,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_a0);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_d8,0x32332a);
      testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
                ((EqHelper<false> *)local_b8,"\"60\"",
                 "HexEncoder::EncodeAsHex((unsigned char *) \"`\", 1)",(char (*) [3])"60",&local_d8)
      ;
      std::__cxx11::string::~string((string *)&local_d8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
      if (!bVar1) {
        testing::Message::Message(&local_e0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                   ,0x1c,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_e0);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_118,0x3232ee);
        testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
                  ((EqHelper<false> *)local_f8,"\"61\"",
                   "HexEncoder::EncodeAsHex((unsigned char *) \"a\", 1)",(char (*) [3])"61",
                   &local_118);
        std::__cxx11::string::~string((string *)&local_118);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
        if (!bVar1) {
          testing::Message::Message(&local_120);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                     ,0x1d,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_120);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_120);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_((uchar *)&local_158,0x32cc43);
          testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
                    ((EqHelper<false> *)local_138,"\"5d\"",
                     "HexEncoder::EncodeAsHex((unsigned char *) \"]\", 1)",(char (*) [3])"5d",
                     &local_158);
          std::__cxx11::string::~string((string *)&local_158);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
          if (!bVar1) {
            testing::Message::Message(&local_160);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                       ,0x1e,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_160);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_160);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
            bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_
                      ((uchar *)&local_198,0x323429);
            testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
                      ((EqHelper<false> *)local_178,"\"7b\"",
                       "HexEncoder::EncodeAsHex((unsigned char *) \"{\", 1)",(char (*) [3])0x323422,
                       &local_198);
            std::__cxx11::string::~string((string *)&local_198);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
            if (!bVar1) {
              testing::Message::Message(&local_1a0);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                         ,0x1f,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_6.message_,&local_1a0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
              testing::Message::~Message(&local_1a0);
            }
            gtest_ar_1.message_.ptr_._5_3_ = 0;
            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
            if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
              bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_
                        ((uchar *)&local_1d8,0x323425);
              testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
                        ((EqHelper<false> *)local_1b8,"\"3a60615d7b\"",
                         "HexEncoder::EncodeAsHex((unsigned char *) \":`a]{\", 5)",
                         (char (*) [11])"3a60615d7b",&local_1d8);
              std::__cxx11::string::~string((string *)&local_1d8);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
              if (!bVar1) {
                testing::Message::Message(&local_1e0);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
                testing::internal::AssertHelper::AssertHelper
                          (&local_1e8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/hex_encoder_test.cpp"
                           ,0x20,pcVar2);
                testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
                testing::internal::AssertHelper::~AssertHelper(&local_1e8);
                testing::Message::~Message(&local_1e0);
              }
              gtest_ar_1.message_.ptr_._5_3_ = 0;
              gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(HexEncoderTest, test_encode_as_hex)
{
    ASSERT_EQ("", HexEncoder::EncodeAsHex((unsigned char *) "", 0));
    ASSERT_EQ("3a", HexEncoder::EncodeAsHex((unsigned char *) ":", 1));
    ASSERT_EQ("60", HexEncoder::EncodeAsHex((unsigned char *) "`", 1));
    ASSERT_EQ("61", HexEncoder::EncodeAsHex((unsigned char *) "a", 1));
    ASSERT_EQ("5d", HexEncoder::EncodeAsHex((unsigned char *) "]", 1));
    ASSERT_EQ("7b", HexEncoder::EncodeAsHex((unsigned char *) "{", 1));
    ASSERT_EQ("3a60615d7b", HexEncoder::EncodeAsHex((unsigned char *) ":`a]{", 5));
}